

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O3

int __thiscall CCEXP::CCEXPMat<int>::AppendRow(CCEXPMat<int> *this,size_t row,int *ptr,size_t n)

{
  size_t sVar1;
  MVECTOR<int> *this_00;
  int iVar2;
  
  iVar2 = 0;
  if (this->IgnoreM == false) {
    this_00 = getDataRowPtr(this,row);
    if (this_00 == (MVECTOR<int> *)0x0) {
      iVar2 = -9999;
      CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",0x11b,
                     "CCEXPMat::AppendRow():: \'it\' is nullptr");
    }
    else {
      sVar1 = this_00->elements;
      ns_MVECTOR::MVECTOR<int>::resize(this_00,n + sVar1);
      memcpy(this_00->pdata + sVar1,ptr,n << 2);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int CCEXPMat<T>::AppendRow(size_t row, T* ptr, size_t n) {
	if (IgnoreM) return 0;
	MVECTOR<T>* it = getDataRowPtr(row); CECS_ERRI(CCEXPECS, it == nullptr, "CCEXPMat::AppendRow():: 'it' is nullptr");
	const size_t currentData = (*it).size();
	(*it).resize(currentData + n);
	T* Dptr = (*it).data();
	memcpy(&Dptr[currentData], ptr, sizeof(T) * n);
	return 0;
}